

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CaseGenerateSyntax::CaseGenerateSyntax
          (CaseGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          SyntaxList<slang::syntax::CaseItemSyntax> *items,Token endCase)

{
  bool bVar1;
  ExpressionSyntax *pEVar2;
  reference ppCVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  ExpressionSyntax *in_stack_00000008;
  CaseItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::CaseItemSyntax> *__range2;
  SyntaxList<slang::syntax::CaseItemSyntax> *in_stack_ffffffffffffff88;
  SyntaxList<slang::syntax::CaseItemSyntax> *this_00;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb0;
  __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffb8;
  MemberSyntax *in_stack_ffffffffffffffc0;
  ExpressionSyntax *local_38 [3];
  undefined8 local_20;
  SyntaxNode *local_18;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_01 = (span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *)&__end2;
  this_00 = (SyntaxList<slang::syntax::CaseItemSyntax> *)&stack0x00000010;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,
             (SyntaxKind)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20),
             in_stack_ffffffffffffffb0);
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  *(undefined8 *)(in_RDI + 4) = local_20;
  in_RDI[4].parent = local_18;
  local_38[0] = in_stack_00000008;
  not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
            ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RDI[4].previewNode,local_38);
  *(_func_int ***)(in_RDI + 5) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[5].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::CaseItemSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff88);
  *(pointer *)(in_RDI + 8) = this_01->_M_ptr;
  in_RDI[8].parent = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  pEVar2 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x780401);
  (pEVar2->super_SyntaxNode).parent = in_RDI;
  in_RDI[6].parent = in_RDI;
  std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff88);
  std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffb8);
    ((*ppCVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

CaseGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, const SyntaxList<CaseItemSyntax>& items, Token endCase) :
        MemberSyntax(SyntaxKind::CaseGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), items(items), endCase(endCase) {
        this->condition->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }